

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadCame_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  short sVar4;
  Node *pNVar5;
  _Elt_pointer psVar6;
  ChunkInfo *pCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  chunk_guard cn;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  chunk_guard local_50;
  shared_ptr<Assimp::COB::Node> local_38;
  
  if (2 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Came");
    return;
  }
  local_50.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  pCVar7 = nfo;
  local_50.nfo = nfo;
  local_50.reader = reader;
  pNVar5 = (Node *)operator_new(0xd8);
  COB::Node::Node(pNVar5,TYPE_CAMERA);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00810310;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Camera*>
            (a_Stack_60,(Camera *)pNVar5);
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_60[0]._M_pi;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pNVar5;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,&local_38);
  if (local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00._M_pi = a_Stack_60[0]._M_pi;
  if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
  }
  psVar6 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar6 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar7 = (ChunkInfo *)
             (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar6 = (_Elt_pointer)(*(long *)&pCVar7[-1].version + 0x200);
  }
  pNVar5 = psVar6[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = nfo->parent_id;
  uVar2 = nfo->version;
  uVar3 = nfo->size;
  (pNVar5->super_ChunkInfo).id = nfo->id;
  (pNVar5->super_ChunkInfo).parent_id = uVar1;
  (pNVar5->super_ChunkInfo).version = uVar2;
  (pNVar5->super_ChunkInfo).size = uVar3;
  ReadBasicNodeInfo_Binary((COBImporter *)this_00._M_pi,pNVar5,reader,pCVar7);
  if (1 < nfo->version) {
    sVar4 = StreamReader<false,_false>::Get<short>(reader);
    if (sVar4 == 0x200) {
      StreamReader<false,_false>::IncPtr(reader,0x2a);
    }
  }
  chunk_guard::~chunk_guard(&local_50);
  return;
}

Assistant:

void COBImporter::ReadCame_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Came");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Camera>(new Camera()));
    Camera& msh = (Camera&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);

    // the rest is not interesting for us, so we skip over it.
    if(nfo.version > 1) {
        if (reader.GetI2()==512) {
            reader.IncPtr(42);
        }
    }
}